

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O3

pair<ska::detailv3::sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>::templated_iterator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
::emplace_new_key<std::pair<slang::DiagCode,std::__cxx11::string>>
          (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
           *this,int8_t distance_from_desired,EntryPointer current_entry,
          pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *key)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  DiagCode DVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  undefined8 uVar6;
  EntryPointer psVar7;
  EntryPointer psVar8;
  long lVar9;
  long lVar10;
  EntryPointer unaff_RBP;
  ulong uVar11;
  char __tmp_1;
  sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
  sVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  pair<ska::detailv3::sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>::templated_iterator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_bool>
  pVar15;
  undefined1 local_60 [8];
  _Alloc_hider local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  undefined1 *local_38;
  
  if ((*(long *)(this + 8) != 0) &&
     (this[0x11] !=
      (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
       )distance_from_desired)) {
    lVar10 = *(long *)(this + 0x18) + 1;
    auVar13._8_4_ = (int)((ulong)lVar10 >> 0x20);
    auVar13._0_8_ = lVar10;
    auVar13._12_4_ = 0x45300000;
    lVar9 = *(long *)(this + 8) + 1;
    auVar14._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar14._0_8_ = lVar9;
    auVar14._12_4_ = 0x45300000;
    if ((auVar13._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar10) - 4503599627370496.0) <=
        (double)*(float *)(this + 0x14) *
        ((auVar14._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      if (current_entry->distance_from_desired < '\0') {
        (current_entry->field_1).value.first = key->first;
        paVar1 = &(current_entry->field_1).value.second.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&current_entry->field_1 + 8) = paVar1;
        pcVar5 = (key->second)._M_dataplus._M_p;
        paVar4 = &(key->second).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar5 == paVar4) {
          uVar6 = *(undefined8 *)((long)&(key->second).field_2 + 8);
          paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
          *(undefined8 *)((long)&(current_entry->field_1).value.second.field_2 + 8) = uVar6;
        }
        else {
          (current_entry->field_1).value.second._M_dataplus._M_p = pcVar5;
          (current_entry->field_1).value.second.field_2._M_allocated_capacity =
               paVar4->_M_allocated_capacity;
        }
        (current_entry->field_1).value.second._M_string_length = (key->second)._M_string_length;
        (key->second)._M_dataplus._M_p = (pointer)paVar4;
        (key->second)._M_string_length = 0;
        (key->second).field_2._M_local_buf[0] = '\0';
        current_entry->distance_from_desired = distance_from_desired;
      }
      else {
        DVar3 = key->first;
        local_58._M_p = (pointer)&local_48;
        paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(key->second)._M_dataplus._M_p;
        paVar1 = &(key->second).field_2;
        if (paVar4 == paVar1) {
          local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_48._8_8_ = *(undefined8 *)((long)&(key->second).field_2 + 8);
        }
        else {
          local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
          local_58._M_p = (pointer)paVar4;
        }
        local_50 = (key->second)._M_string_length;
        (key->second)._M_dataplus._M_p = (pointer)paVar1;
        (key->second)._M_string_length = 0;
        (key->second).field_2._M_local_buf[0] = '\0';
        cVar2 = current_entry->distance_from_desired;
        current_entry->distance_from_desired = distance_from_desired;
        local_60._0_4_ = (current_entry->field_1).value.first;
        (current_entry->field_1).value.first = DVar3;
        local_38 = (undefined1 *)((long)&current_entry->field_1 + 8);
        std::__cxx11::string::swap((string *)&local_58);
        sVar12 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                  )(cVar2 + '\x01');
        cVar2 = current_entry[1].distance_from_desired;
        psVar8 = current_entry + 1;
        psVar7 = current_entry;
        DVar3 = (DiagCode)local_60._0_4_;
        while (unaff_RBP = psVar8, -1 < cVar2) {
          if (cVar2 < (char)sVar12) {
            unaff_RBP->distance_from_desired = (int8_t)sVar12;
            local_60._0_4_ = (unaff_RBP->field_1).value.first;
            (unaff_RBP->field_1).value.first = DVar3;
            std::__cxx11::string::swap((string *)&local_58);
            sVar12 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                      )(cVar2 + '\x01');
          }
          else {
            sVar12 = (sherwood_v3_table<std::pair<slang::DiagCode,std::__cxx11::string>,slang::DiagCode,slang::Hasher<slang::DiagCode>,ska::detailv3::KeyOrValueHasher<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,slang::Hasher<slang::DiagCode>>,std::equal_to<slang::DiagCode>,ska::detailv3::KeyOrValueEquality<slang::DiagCode,std::pair<slang::DiagCode,std::__cxx11::string>,std::equal_to<slang::DiagCode>>,std::allocator<std::pair<slang::DiagCode,std::__cxx11::string>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,std::__cxx11::string>>>>
                      )((char)sVar12 + '\x01');
            local_60._0_4_ = DVar3;
            if (sVar12 == this[0x11]) {
              local_60._0_4_ = (current_entry->field_1).value.first;
              (current_entry->field_1).value.first = DVar3;
              std::__cxx11::string::swap((string *)&local_58);
              sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::grow((sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)this);
              pVar15 = emplace<std::pair<slang::DiagCode,std::__cxx11::string>>
                                 (this,(pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                        *)local_60);
              current_entry = (EntryPointer)pVar15.first.current;
              uVar11 = (ulong)pVar15._8_4_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_p != &local_48) {
                operator_delete(local_58._M_p,local_48._M_allocated_capacity + 1);
              }
              goto LAB_00158aba;
            }
          }
          psVar8 = unaff_RBP + 1;
          psVar7 = unaff_RBP;
          DVar3 = (DiagCode)local_60._0_4_;
          cVar2 = unaff_RBP[1].distance_from_desired;
        }
        psVar7[1].field_1.value.first = DVar3;
        paVar1 = &psVar7[1].field_1.value.second.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)&psVar7[1].field_1 + 8) = paVar1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_p == &local_48) {
          paVar1->_M_allocated_capacity = local_48._M_allocated_capacity;
          *(undefined8 *)((long)&psVar7[1].field_1.value.second.field_2 + 8) = local_48._8_8_;
        }
        else {
          psVar7[1].field_1.value.second._M_dataplus._M_p = local_58._M_p;
          psVar7[1].field_1.value.second.field_2._M_allocated_capacity =
               local_48._M_allocated_capacity;
        }
        psVar7[1].field_1.value.second._M_string_length = local_50;
        unaff_RBP->distance_from_desired = (int8_t)sVar12;
      }
      *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
      uVar11 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
      goto LAB_00158aba;
    }
  }
  sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::grow((sherwood_v3_table<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::DiagCode,_slang::Hasher<slang::DiagCode>,_ska::detailv3::KeyOrValueHasher<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_slang::Hasher<slang::DiagCode>_>,_std::equal_to<slang::DiagCode>,_ska::detailv3::KeyOrValueEquality<slang::DiagCode,_std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<slang::DiagCode>_>,_std::allocator<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<slang::DiagCode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          *)this);
  pVar15 = emplace<std::pair<slang::DiagCode,std::__cxx11::string>>(this,key);
  current_entry = (EntryPointer)pVar15.first.current;
  uVar11 = (ulong)pVar15._8_4_;
LAB_00158aba:
  pVar15._8_8_ = uVar11 & 0xffffffff;
  pVar15.first.current = current_entry;
  return pVar15;
}

Assistant:

emplace_new_key(int8_t distance_from_desired, EntryPointer current_entry, Key && key, Args &&... args)
    {
        using std::swap;
        if (num_slots_minus_one == 0 || distance_from_desired == max_lookups || num_elements + 1 > (num_slots_minus_one + 1) * static_cast<double>(_max_load_factor))
        {
            grow();
            return emplace(std::forward<Key>(key), std::forward<Args>(args)...);
        }
        else if (current_entry->is_empty())
        {
            current_entry->emplace(distance_from_desired, std::forward<Key>(key), std::forward<Args>(args)...);
            ++num_elements;
            return { { current_entry }, true };
        }
        value_type to_insert(std::forward<Key>(key), std::forward<Args>(args)...);
        swap(distance_from_desired, current_entry->distance_from_desired);
        swap(to_insert, current_entry->value);
        iterator result = { current_entry };
        for (++distance_from_desired, ++current_entry;; ++current_entry)
        {
            if (current_entry->is_empty())
            {
                current_entry->emplace(distance_from_desired, std::move(to_insert));
                ++num_elements;
                return { result, true };
            }
            else if (current_entry->distance_from_desired < distance_from_desired)
            {
                swap(distance_from_desired, current_entry->distance_from_desired);
                swap(to_insert, current_entry->value);
                ++distance_from_desired;
            }
            else
            {
                ++distance_from_desired;
                if (distance_from_desired == max_lookups)
                {
                    swap(to_insert, result.current->value);
                    grow();
                    return emplace(std::move(to_insert));
                }
            }
        }
    }